

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumprwtree.cpp
# Opt level: O3

void readchunk(StreamFile *s,ChunkHeaderInfo *h,int level)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  ChunkHeaderInfo nh;
  ChunkHeaderInfo local_40;
  
  iVar4 = level;
  if (0 < level) {
    do {
      printf("  ");
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  pcVar3 = getChunkName(h->type);
  uVar2 = h->length;
  iVar4 = (*(s->super_Stream)._vptr_Stream[6])(s);
  uVar1 = (*(s->super_Stream)._vptr_Stream[6])(s);
  printf("%s (%x bytes @ 0x%x/0x%x) - [0x%x]\n",pcVar3,(ulong)uVar2,(ulong)(iVar4 - 0xc),
         (ulong)uVar1,(ulong)h->type);
  iVar4 = (*(s->super_Stream)._vptr_Stream[6])(s);
  uVar1 = iVar4 + h->length;
  uVar2 = (*(s->super_Stream)._vptr_Stream[6])(s);
  if (uVar2 < uVar1) {
    do {
      rw::readChunkHeaderInfo(&s->super_Stream,&local_40);
      if ((local_40.version != h->version) || (local_40.build != h->build)) {
        (*(s->super_Stream)._vptr_Stream[5])(s,(ulong)(h->length - 0xc),1);
        return;
      }
      readchunk(s,&local_40,level + 1);
      if (h->type == 0x510) {
        (*(s->super_Stream)._vptr_Stream[5])(s,(ulong)uVar1,0);
      }
      uVar2 = (*(s->super_Stream)._vptr_Stream[6])(s);
    } while (uVar2 < uVar1);
  }
  return;
}

Assistant:

void
readchunk(StreamFile *s, ChunkHeaderInfo *h, int level)
{
	for(int i = 0; i < level; i++)
		printf("  ");
	const char *name = getChunkName(h->type);
	printf("%s (%x bytes @ 0x%x/0x%x) - [0x%x]\n",
		name, h->length, s->tell()-12, s->tell(), h->type);

	uint32 end = s->tell() + h->length;
	while(s->tell() < end){
		ChunkHeaderInfo nh;
		readChunkHeaderInfo(s, &nh);
		if(nh.version == h->version && nh.build == h->build){
			readchunk(s, &nh, level+1);
			if(h->type == 0x510)
				s->seek(end, 0);
		}else{
			s->seek(h->length-12);
			break;
		}
	}
}